

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_buffer_reserve(ptls_buffer_t *buf,size_t delta)

{
  uint8_t *__src;
  size_t __n;
  ulong uVar1;
  uint8_t *__dest;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  __src = buf->base;
  iVar3 = 0x201;
  if (__src != (uint8_t *)0x0) {
    uVar2 = buf->capacity;
    __n = buf->off;
    uVar4 = delta + __n;
    if (uVar2 < uVar4) {
      uVar1 = 0x400;
      if (0x400 < uVar2) {
        uVar1 = uVar2;
      }
      do {
        uVar2 = uVar1;
        uVar1 = uVar2 * 2;
      } while (uVar2 < uVar4);
      __dest = (uint8_t *)malloc(uVar2);
      if (__dest == (uint8_t *)0x0) {
        return 0x201;
      }
      memcpy(__dest,__src,__n);
      ptls_buffer__release_memory(buf);
      buf->base = __dest;
      buf->capacity = uVar2;
      buf->is_allocated = 1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ptls_buffer_reserve(ptls_buffer_t *buf, size_t delta)
{
    if (buf->base == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if (PTLS_MEMORY_DEBUG || buf->capacity < buf->off + delta) {
        uint8_t *newp;
        size_t new_capacity = buf->capacity;
        if (new_capacity < 1024)
            new_capacity = 1024;
        while (new_capacity < buf->off + delta) {
            new_capacity *= 2;
        }
        if ((newp = malloc(new_capacity)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(newp, buf->base, buf->off);
        ptls_buffer__release_memory(buf);
        buf->base = newp;
        buf->capacity = new_capacity;
        buf->is_allocated = 1;
    }

    return 0;
}